

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

LineHeight
Rml::ComputeLineHeight
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  code *pcVar1;
  LineHeight LVar2;
  bool bVar3;
  Units units;
  NumericValue value_00;
  float value_01;
  float local_4c;
  float value;
  float scale_factor;
  float value_1;
  float dp_ratio_local;
  float document_font_size_local;
  float font_size_local;
  Property *property_local;
  Vector2f vp_dimensions_local;
  float local_c;
  
  units = operator&(property->unit,LENGTH);
  bVar3 = Any(units);
  if (bVar3) {
    value_00 = Property::GetNumericValue(property);
    value_01 = ComputeLength(value_00,font_size,document_font_size,dp_ratio,vp_dimensions);
    Style::LineHeight::LineHeight((LineHeight *)&vp_dimensions_local,value_01,Length,value_01);
  }
  else {
    local_4c = 1.0;
    if (property->unit == NUMBER) {
      local_4c = Variant::Get<float>(&property->value,0.0);
    }
    else if (property->unit == PERCENT) {
      local_4c = Variant::Get<float>(&property->value,0.0);
      local_4c = local_4c * 0.01;
    }
    else {
      bVar3 = Assert("Invalid unit for line-height",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0xb2);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    Style::LineHeight::LineHeight
              ((LineHeight *)&vp_dimensions_local,font_size * local_4c,Number,local_4c);
  }
  LVar2.inherit_value = local_c;
  LVar2._0_8_ = vp_dimensions_local;
  return LVar2;
}

Assistant:

Style::LineHeight ComputeLineHeight(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(property->unit & Unit::LENGTH))
	{
		float value = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
		return Style::LineHeight(value, Style::LineHeight::Length, value);
	}

	float scale_factor = 1.0f;

	switch (property->unit)
	{
	case Unit::NUMBER: scale_factor = property->value.Get<float>(); break;
	case Unit::PERCENT: scale_factor = property->value.Get<float>() * 0.01f; break;
	default: RMLUI_ERRORMSG("Invalid unit for line-height");
	}

	float value = font_size * scale_factor;
	return Style::LineHeight(value, Style::LineHeight::Number, scale_factor);
}